

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O1

bool gpt_params_parse(int argc,char **argv,gpt_params *params)

{
  uint uVar1;
  bool bVar2;
  _Alloc_hider _Var3;
  int iVar4;
  int *piVar5;
  long lVar6;
  undefined8 extraout_RAX;
  int iVar7;
  float fVar9;
  istreambuf_iterator<char,_std::char_traits<char>_> __first;
  string arg;
  ifstream file;
  int local_2a4;
  char **local_2a0;
  char *local_298;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_290;
  string *local_288;
  string *local_280;
  string local_278;
  string local_258;
  uint auStack_238 [50];
  undefined8 auStack_170 [36];
  string local_50;
  string *psVar8;
  
  local_2a4 = 1;
  if (1 < argc) {
    local_288 = (string *)&params->token_test;
    local_290.container = &params->prompt;
    local_280 = (string *)&params->model;
    local_2a0 = argv;
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_278,argv[local_2a4],(allocator<char> *)&local_258);
      iVar4 = std::__cxx11::string::compare((char *)&local_278);
      if ((iVar4 == 0) || (iVar4 = std::__cxx11::string::compare((char *)&local_278), iVar4 == 0)) {
        get_next_arg(&local_258,&local_2a4,argc,argv,&local_278,params);
        _Var3._M_p = local_258._M_dataplus._M_p;
        piVar5 = __errno_location();
        iVar4 = *piVar5;
        *piVar5 = 0;
        lVar6 = strtol(_Var3._M_p,&local_298,10);
        if (local_298 == _Var3._M_p) {
          std::__throw_invalid_argument("stoi");
        }
        else if ((0xfffffffeffffffff < lVar6 - 0x80000000U) && (*piVar5 != 0x22)) {
          if (*piVar5 == 0) {
            *piVar5 = iVar4;
          }
          params->seed = (int32_t)lVar6;
LAB_0010e750:
          argv = local_2a0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_258._M_dataplus._M_p != &local_258.field_2) {
            operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
            argv = local_2a0;
          }
          goto LAB_0010e771;
        }
        std::__throw_out_of_range("stoi");
LAB_0010ec26:
        std::__throw_out_of_range("stoi");
LAB_0010ec32:
        std::__throw_invalid_argument("stoi");
LAB_0010ec3e:
        std::__throw_out_of_range("stoi");
LAB_0010ec4a:
        std::__throw_invalid_argument("stoi");
LAB_0010ec56:
        std::__throw_out_of_range("stoi");
LAB_0010ec62:
        iVar7 = 0x1227ea;
        std::__throw_invalid_argument("stoi");
LAB_0010ec6e:
        gpt_print_usage(iVar7,local_2a0,params);
        exit(0);
      }
      iVar4 = std::__cxx11::string::compare((char *)&local_278);
      if ((iVar4 == 0) || (iVar4 = std::__cxx11::string::compare((char *)&local_278), iVar4 == 0)) {
        get_next_arg(&local_258,&local_2a4,argc,argv,&local_278,params);
        _Var3._M_p = local_258._M_dataplus._M_p;
        piVar5 = __errno_location();
        iVar4 = *piVar5;
        *piVar5 = 0;
        lVar6 = strtol(_Var3._M_p,&local_298,10);
        if (local_298 != _Var3._M_p) {
          if ((0xfffffffeffffffff < lVar6 - 0x80000000U) && (*piVar5 != 0x22)) {
            if (*piVar5 == 0) {
              *piVar5 = iVar4;
            }
            params->n_threads = (int32_t)lVar6;
            goto LAB_0010e750;
          }
          goto LAB_0010ec26;
        }
        goto LAB_0010ec32;
      }
      iVar4 = std::__cxx11::string::compare((char *)&local_278);
      if ((iVar4 == 0) || (iVar4 = std::__cxx11::string::compare((char *)&local_278), iVar4 == 0)) {
        get_next_arg(&local_258,&local_2a4,argc,argv,&local_278,params);
        std::__cxx11::string::operator=((string *)local_290.container,(string *)&local_258);
        goto LAB_0010e7d5;
      }
      iVar4 = std::__cxx11::string::compare((char *)&local_278);
      if ((iVar4 == 0) || (iVar4 = std::__cxx11::string::compare((char *)&local_278), iVar4 == 0)) {
        get_next_arg(&local_258,&local_2a4,argc,argv,&local_278,params);
        _Var3._M_p = local_258._M_dataplus._M_p;
        piVar5 = __errno_location();
        iVar4 = *piVar5;
        *piVar5 = 0;
        lVar6 = strtol(_Var3._M_p,&local_298,10);
        if (local_298 != _Var3._M_p) {
          if ((0xfffffffeffffffff < lVar6 - 0x80000000U) && (*piVar5 != 0x22)) {
            if (*piVar5 == 0) {
              *piVar5 = iVar4;
            }
            params->n_predict = (int32_t)lVar6;
            goto LAB_0010e750;
          }
          goto LAB_0010ec3e;
        }
        goto LAB_0010ec4a;
      }
      iVar4 = std::__cxx11::string::compare((char *)&local_278);
      if ((iVar4 == 0) || (iVar4 = std::__cxx11::string::compare((char *)&local_278), iVar4 == 0)) {
        get_next_arg(&local_258,&local_2a4,argc,argv,&local_278,params);
        _Var3._M_p = local_258._M_dataplus._M_p;
        piVar5 = __errno_location();
        iVar4 = *piVar5;
        *piVar5 = 0;
        lVar6 = strtol(_Var3._M_p,&local_298,10);
        if (local_298 != _Var3._M_p) {
          if ((0xfffffffeffffffff < lVar6 - 0x80000000U) && (*piVar5 != 0x22)) {
            if (*piVar5 == 0) {
              *piVar5 = iVar4;
            }
            params->n_parallel = (int32_t)lVar6;
            goto LAB_0010e750;
          }
          goto LAB_0010ec56;
        }
        goto LAB_0010ec62;
      }
      iVar4 = std::__cxx11::string::compare((char *)&local_278);
      if (iVar4 == 0) {
        get_next_arg(&local_258,&local_2a4,argc,argv,&local_278,params);
        iVar4 = std::__cxx11::stoi(&local_258,(size_t *)0x0,10);
        params->top_k = iVar4;
LAB_0010e7d5:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_dataplus._M_p != &local_258.field_2) {
          operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
        }
LAB_0010e771:
        bVar2 = false;
      }
      else {
        iVar4 = std::__cxx11::string::compare((char *)&local_278);
        if (iVar4 == 0) {
          get_next_arg(&local_258,&local_2a4,argc,argv,&local_278,params);
          fVar9 = std::__cxx11::stof(&local_258,(size_t *)0x0);
          params->top_p = fVar9;
          goto LAB_0010e7d5;
        }
        iVar4 = std::__cxx11::string::compare((char *)&local_278);
        if (iVar4 == 0) {
          get_next_arg(&local_258,&local_2a4,argc,argv,&local_278,params);
          fVar9 = std::__cxx11::stof(&local_258,(size_t *)0x0);
          params->temp = fVar9;
          goto LAB_0010e7d5;
        }
        iVar4 = std::__cxx11::string::compare((char *)&local_278);
        if (iVar4 == 0) {
          get_next_arg(&local_258,&local_2a4,argc,argv,&local_278,params);
          iVar4 = std::__cxx11::stoi(&local_258,(size_t *)0x0,10);
          params->repeat_last_n = iVar4;
          goto LAB_0010e7d5;
        }
        iVar4 = std::__cxx11::string::compare((char *)&local_278);
        if (iVar4 == 0) {
          get_next_arg(&local_258,&local_2a4,argc,argv,&local_278,params);
          fVar9 = std::__cxx11::stof(&local_258,(size_t *)0x0);
          params->repeat_penalty = fVar9;
          goto LAB_0010e7d5;
        }
        iVar4 = std::__cxx11::string::compare((char *)&local_278);
        if ((iVar4 == 0) || (iVar4 = std::__cxx11::string::compare((char *)&local_278), iVar4 == 0))
        {
          get_next_arg(&local_258,&local_2a4,argc,argv,&local_278,params);
          iVar4 = std::__cxx11::stoi(&local_258,(size_t *)0x0,10);
          params->n_batch = iVar4;
          goto LAB_0010e7d5;
        }
        iVar4 = std::__cxx11::string::compare((char *)&local_278);
        if ((iVar4 == 0) || (iVar4 = std::__cxx11::string::compare((char *)&local_278), iVar4 == 0))
        {
          get_next_arg(&local_258,&local_2a4,argc,argv,&local_278,params);
          iVar4 = std::__cxx11::stoi(&local_258,(size_t *)0x0,10);
          params->n_ctx = iVar4;
          goto LAB_0010e7d5;
        }
        iVar4 = std::__cxx11::string::compare((char *)&local_278);
        if (((iVar4 == 0) || (iVar4 = std::__cxx11::string::compare((char *)&local_278), iVar4 == 0)
            ) || (iVar4 = std::__cxx11::string::compare((char *)&local_278), iVar4 == 0)) {
          get_next_arg(&local_258,&local_2a4,argc,argv,&local_278,params);
          iVar4 = std::__cxx11::stoi(&local_258,(size_t *)0x0,10);
          params->n_gpu_layers = iVar4;
          goto LAB_0010e7d5;
        }
        iVar4 = std::__cxx11::string::compare((char *)&local_278);
        if (iVar4 == 0) {
          params->ignore_eos = true;
          goto LAB_0010e771;
        }
        iVar4 = std::__cxx11::string::compare((char *)&local_278);
        if ((iVar4 == 0) || (iVar4 = std::__cxx11::string::compare((char *)&local_278), iVar4 == 0))
        {
          get_next_arg(&local_258,&local_2a4,argc,argv,&local_278,params);
          std::__cxx11::string::operator=(local_280,(string *)&local_258);
          goto LAB_0010e750;
        }
        iVar4 = std::__cxx11::string::compare((char *)&local_278);
        if ((iVar4 == 0) || (iVar4 = std::__cxx11::string::compare((char *)&local_278), iVar4 == 0))
        {
          params->interactive = true;
          argv = local_2a0;
          goto LAB_0010e771;
        }
        iVar4 = std::__cxx11::string::compare((char *)&local_278);
        if ((iVar4 == 0) || (iVar4 = std::__cxx11::string::compare((char *)&local_278), iVar4 == 0))
        {
          params->interactive = true;
          get_next_arg(&local_258,&local_2a4,argc,local_2a0,&local_278,params);
          iVar4 = std::__cxx11::stoi(&local_258,(size_t *)0x0,10);
          params->interactive_port = iVar4;
LAB_0010eae9:
          argv = local_2a0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_258._M_dataplus._M_p != &local_258.field_2) {
            operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
            argv = local_2a0;
          }
          goto LAB_0010e771;
        }
        psVar8 = &local_278;
        iVar4 = std::__cxx11::string::compare((char *)&local_278);
        iVar7 = (int)psVar8;
        if (iVar4 == 0) goto LAB_0010ec6e;
        psVar8 = &local_278;
        iVar4 = std::__cxx11::string::compare((char *)&local_278);
        iVar7 = (int)psVar8;
        if (iVar4 == 0) goto LAB_0010ec6e;
        iVar4 = std::__cxx11::string::compare((char *)&local_278);
        if ((iVar4 != 0) && (iVar4 = std::__cxx11::string::compare((char *)&local_278), iVar4 != 0))
        {
          iVar4 = std::__cxx11::string::compare((char *)&local_278);
          if ((iVar4 != 0) &&
             (iVar4 = std::__cxx11::string::compare((char *)&local_278), iVar4 != 0)) {
            gpt_params_parse();
            std::ifstream::~ifstream(&local_258);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_278._M_dataplus._M_p != &local_278.field_2) {
              operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1
                             );
            }
            _Unwind_Resume(extraout_RAX);
          }
          get_next_arg(&local_258,&local_2a4,argc,local_2a0,&local_278,params);
          std::__cxx11::string::operator=(local_288,(string *)&local_258);
          goto LAB_0010eae9;
        }
        get_next_arg(&local_50,&local_2a4,argc,local_2a0,&local_278,params);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        std::ifstream::ifstream(&local_258,local_2a0[local_2a4],_S_in);
        uVar1 = *(uint *)((long)auStack_238 + *(long *)(local_258._M_dataplus._M_p + -0x18));
        if ((uVar1 & 5) == 0) {
          __first._8_8_ = 0xffffffff;
          __first._M_sbuf =
               *(streambuf_type **)
                ((long)auStack_170 + *(long *)(local_258._M_dataplus._M_p + -0x18));
          std::__copy_move<false,false,std::input_iterator_tag>::
          __copy_m<std::istreambuf_iterator<char,std::char_traits<char>>,std::back_insert_iterator<std::__cxx11::string>>
                    (__first,(istreambuf_iterator<char,_std::char_traits<char>_>)
                             (ZEXT816(0xffffffff) << 0x40),local_290);
          bVar2 = false;
          if ((params->prompt)._M_dataplus._M_p[(params->prompt)._M_string_length - 1] == '\n') {
            std::__cxx11::string::pop_back();
          }
        }
        else {
          gpt_params_parse();
          bVar2 = true;
        }
        std::ifstream::~ifstream(&local_258);
        argv = local_2a0;
        if ((uVar1 & 5) == 0) goto LAB_0010e771;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
      }
    } while ((!bVar2) && (local_2a4 = local_2a4 + 1, local_2a4 < argc));
  }
  return true;
}

Assistant:

bool gpt_params_parse(int argc, char ** argv, gpt_params & params) {
    for (int i = 1; i < argc; i++) {
        std::string arg = argv[i];

        if (arg == "-s" || arg == "--seed") {
            params.seed = std::stoi(get_next_arg(i, argc, argv, arg, params));
        } else if (arg == "-t" || arg == "--threads") {
            params.n_threads = std::stoi(get_next_arg(i, argc, argv, arg, params));
        } else if (arg == "-p" || arg == "--prompt") {
            params.prompt = get_next_arg(i, argc, argv, arg, params);
        } else if (arg == "-n" || arg == "--n_predict") {
            params.n_predict = std::stoi(get_next_arg(i, argc, argv, arg, params));
        } else if (arg == "-np" || arg == "--n_parallel") {
            params.n_parallel = std::stoi(get_next_arg(i, argc, argv, arg, params));
        } else if (arg == "--top_k") {
            params.top_k = std::stoi(get_next_arg(i, argc, argv, arg, params));
        } else if (arg == "--top_p") {
            params.top_p = std::stof(get_next_arg(i, argc, argv, arg, params));
        } else if (arg == "--temp") {
            params.temp = std::stof(get_next_arg(i, argc, argv, arg, params));
        } else if (arg == "--repeat-last-n") {
            params.repeat_last_n = std::stoi(get_next_arg(i, argc, argv, arg, params));
        } else if (arg == "--repeat-penalty") {
            params.repeat_penalty = std::stof(get_next_arg(i, argc, argv, arg, params));
        } else if (arg == "-b" || arg == "--batch_size") {
            params.n_batch= std::stoi(get_next_arg(i, argc, argv, arg, params));
        } else if (arg == "-c" || arg == "--context") {
            params.n_ctx= std::stoi(get_next_arg(i, argc, argv, arg, params));
        } else if (arg == "-ngl" || arg == "--gpu-layers" || arg == "--n-gpu-layers") {
            params.n_gpu_layers = std::stoi(get_next_arg(i, argc, argv, arg, params));
        } else if (arg == "--ignore-eos") {
            params.ignore_eos = true;
        } else if (arg == "-m" || arg == "--model") {
            params.model = get_next_arg(i, argc, argv, arg, params);
        } else if (arg == "-i" || arg == "--interactive") {
            params.interactive = true;
        } else if (arg == "-ip" || arg == "--interactive-port") {
            params.interactive = true;
            params.interactive_port = std::stoi(get_next_arg(i, argc, argv, arg, params));
        } else if (arg == "-h" || arg == "--help") {
            gpt_print_usage(argc, argv, params);
            exit(0);
        } else if (arg == "-f" || arg == "--file") {
            get_next_arg(i, argc, argv, arg, params);
            std::ifstream file(argv[i]);
            if (!file) {
                fprintf(stderr, "error: failed to open file '%s'\n", argv[i]);
                break;
            }
            std::copy(std::istreambuf_iterator<char>(file), std::istreambuf_iterator<char>(), back_inserter(params.prompt));
            if (params.prompt.back() == '\n') {
                params.prompt.pop_back();
            }
        } else if (arg == "-tt" || arg == "--token_test") {
            params.token_test = get_next_arg(i, argc, argv, arg, params);
        }
        else {
            fprintf(stderr, "error: unknown argument: %s\n", arg.c_str());
            gpt_print_usage(argc, argv, params);
            exit(0);
        }
    }

    return true;
}